

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O0

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::Request(ZmqReqRep *this,char *request,size_t size)

{
  rep rVar1;
  char *pcVar2;
  size_type sVar3;
  char *__src;
  undefined8 in_RCX;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int *in_RSI;
  element_type *in_RDI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar5;
  __enable_if_is_duration<std::chrono::duration<long>_> duration_1;
  time_point now_time_1;
  __enable_if_is_duration<std::chrono::duration<long>_> duration;
  time_point now_time;
  time_point start_time;
  int ret;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *reply;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff08;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff10;
  __enable_if_is_duration<std::chrono::duration<long>_> in_stack_ffffffffffffff18;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  duration<long,_std::ratio<1L,_1L>_> local_78;
  undefined8 local_70;
  undefined8 local_68;
  rep local_58;
  duration<long,_std::ratio<1L,_1L>_> local_50;
  undefined8 local_48;
  undefined8 local_30;
  int local_28;
  undefined1 local_21;
  undefined8 local_20;
  undefined8 local_18;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::make_shared<std::vector<char,std::allocator<char>>>();
  local_28 = -1;
  local_30 = std::chrono::_V2::system_clock::now();
  do {
    if (0 < local_28) {
      local_28 = -1;
      local_68 = std::chrono::_V2::system_clock::now();
      local_30 = local_68;
      goto LAB_00dbaeda;
    }
    local_28 = zmq_send(*(undefined8 *)(in_RSI + 10),local_18,local_20,0);
    local_48 = std::chrono::_V2::system_clock::now();
    local_58 = (rep)std::chrono::operator-(in_stack_ffffffffffffff18.__r,in_stack_ffffffffffffff10);
    local_50.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff08);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_50);
  } while (rVar1 <= *in_RSI);
  zmq_close(*(undefined8 *)(in_RSI + 10));
  _Var4._M_pi = extraout_RDX;
  goto LAB_00dbb040;
  while( true ) {
    in_stack_ffffffffffffff30 = *(vector<char,_std::allocator<char>_> **)(in_RSI + 10);
    in_stack_ffffffffffffff28 = (vector<char,_std::allocator<char>_> *)(in_RSI + 2);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0xdbaf04);
    sVar3 = std::vector<char,_std::allocator<char>_>::capacity(in_stack_ffffffffffffff28);
    local_28 = zmq_recv(in_stack_ffffffffffffff30,pcVar2,sVar3,0);
    local_70 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff18.__r,in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff18 =
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                   (in_stack_ffffffffffffff08);
    local_78.__r = in_stack_ffffffffffffff18.__r;
    in_stack_ffffffffffffff10 =
         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *)std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_78);
    if ((long)*in_RSI < (long)in_stack_ffffffffffffff10) break;
LAB_00dbaeda:
    if (0 < local_28) {
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xdbafe3);
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xdbafff);
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0xdbb007);
      __src = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0xdbb019);
      memcpy(pcVar2,__src,(long)local_28);
      _Var4._M_pi = extraout_RDX_01;
      goto LAB_00dbb040;
    }
  }
  zmq_close(*(undefined8 *)(in_RSI + 10));
  _Var4._M_pi = extraout_RDX_00;
LAB_00dbb040:
  sVar5.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar5.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::Request(const char *request, const size_t size)
{
    auto reply = std::make_shared<std::vector<char>>();

    int ret = -1;
    auto start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_send(m_Socket, request, size, 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(m_Socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_recv(m_Socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(m_Socket);
            return reply;
        }
    }

    reply->resize(ret);
    std::memcpy(reply->data(), m_ReceiverBuffer.data(), ret);
    return reply;
}